

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprNeedsNoAffinityChange(Expr *p,char aff)

{
  bool bVar1;
  bool bVar2;
  bool local_2a;
  bool local_29;
  u8 local_1a;
  int unaryMinus;
  u8 op;
  char aff_local;
  Expr *p_local;
  
  bVar1 = false;
  _unaryMinus = p;
  if (aff == 'A') {
    p_local._4_4_ = 1;
  }
  else {
    while( true ) {
      bVar2 = true;
      if (_unaryMinus->op != 0xae) {
        bVar2 = _unaryMinus->op == 0xad;
      }
      if (!bVar2) break;
      if (_unaryMinus->op == 0xad) {
        bVar1 = true;
      }
      _unaryMinus = _unaryMinus->pLeft;
    }
    local_1a = _unaryMinus->op;
    if (local_1a == 0xb0) {
      local_1a = _unaryMinus->op2;
    }
    if (local_1a == 'u') {
      local_29 = !bVar1 && aff == 'B';
      p_local._4_4_ = (uint)local_29;
    }
    else if (local_1a == 0x99) {
      p_local._4_4_ = (uint)('B' < aff);
    }
    else if (local_1a == 0x9a) {
      p_local._4_4_ = (uint)((bVar1 ^ 0xffU) & 1);
    }
    else if (local_1a == 0x9b) {
      p_local._4_4_ = (uint)('B' < aff);
    }
    else if (local_1a == 0xa7) {
      local_2a = false;
      if ('B' < aff) {
        local_2a = _unaryMinus->iColumn < 0;
      }
      p_local._4_4_ = (uint)local_2a;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprNeedsNoAffinityChange(const Expr *p, char aff){
  u8 op;
  int unaryMinus = 0;
  if( aff==SQLITE_AFF_BLOB ) return 1;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){
    if( p->op==TK_UMINUS ) unaryMinus = 1;
    p = p->pLeft;
  }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER: {
      return aff>=SQLITE_AFF_NUMERIC;
    }
    case TK_FLOAT: {
      return aff>=SQLITE_AFF_NUMERIC;
    }
    case TK_STRING: {
      return !unaryMinus && aff==SQLITE_AFF_TEXT;
    }
    case TK_BLOB: {
      return !unaryMinus;
    }
    case TK_COLUMN: {
      assert( p->iTable>=0 );  /* p cannot be part of a CHECK constraint */
      return aff>=SQLITE_AFF_NUMERIC && p->iColumn<0;
    }
    default: {
      return 0;
    }
  }
}